

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

int err_unwind_jit(int version,int actions,uint64_t uexclass,_Unwind_Exception *uex,
                  _Unwind_Context *ctx)

{
  long lVar1;
  uintptr_t uVar2;
  long in_RCX;
  ulong in_RDX;
  uint in_ESI;
  int in_EDI;
  undefined8 in_R8;
  uintptr_t stub;
  uintptr_t addr;
  ExitNo exitno;
  global_State *g;
  ExitNo local_34;
  long local_30;
  undefined8 local_28;
  ulong local_18;
  int local_4;
  
  if ((in_EDI == 1) && ((in_RDX ^ 0x4c55414a49543200) < 0x100)) {
    if ((in_ESI & 1) == 0) {
      if ((in_ESI & 2) == 0) {
        local_4 = 3;
      }
      else {
        local_30 = *(long *)(in_RCX + 0x20);
        local_28 = in_R8;
        local_18 = in_RDX;
        lVar1 = _Unwind_GetIP(in_R8);
        uVar2 = lj_trace_unwind((jit_State *)(local_30 + 0x248),lVar1 - 1,&local_34);
        if (uVar2 == 0) {
          local_4 = 2;
        }
        else {
          *(uint *)(local_30 + 0xbf8) = (uint)local_18 & 0xff;
          _Unwind_SetIP(local_28,uVar2);
          local_4 = 7;
        }
      }
    }
    else {
      local_4 = 6;
    }
  }
  else {
    local_4 = 3;
  }
  return local_4;
}

Assistant:

static int err_unwind_jit(int version, int actions,
  uint64_t uexclass, _Unwind_Exception *uex, _Unwind_Context *ctx)
{
  /* NYI: FFI C++ exception interoperability. */
  if (version != 1 || !LJ_UEXCLASS_CHECK(uexclass))
    return _URC_FATAL_PHASE1_ERROR;
  if ((actions & _UA_SEARCH_PHASE)) {
    return _URC_HANDLER_FOUND;
  }
  if ((actions & _UA_CLEANUP_PHASE)) {
    global_State *g = *(global_State **)(uex+1);
    ExitNo exitno;
    uintptr_t addr = _Unwind_GetIP(ctx);  /* Return address _after_ call. */
    uintptr_t stub = lj_trace_unwind(G2J(g), addr - sizeof(MCode), &exitno);
    lj_assertG(tvref(g->jit_base), "unexpected throw across mcode frame");
    if (stub) {  /* Jump to side exit to unwind the trace. */
      G2J(g)->exitcode = LJ_UEXCLASS_ERRCODE(uexclass);
#ifdef LJ_TARGET_MIPS
      _Unwind_SetGR(ctx, 4, stub);
      _Unwind_SetGR(ctx, 5, exitno);
      _Unwind_SetIP(ctx, (uintptr_t)(void *)lj_vm_unwind_stub);
#else
      _Unwind_SetIP(ctx, stub);
#endif
      return _URC_INSTALL_CONTEXT;
    }
    return _URC_FATAL_PHASE2_ERROR;
  }
  return _URC_FATAL_PHASE1_ERROR;
}